

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryReader::~BinaryRegistryReader(BinaryRegistryReader *this)

{
  de::details::
  UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
  ::~UniqueBase(&(this->m_binaryIndex).
                 super_UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
               );
  std::__cxx11::string::~string((string *)&this->m_srcPath);
  return;
}

Assistant:

BinaryRegistryReader::~BinaryRegistryReader (void)
{
}